

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineInputAssemblyTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createInputAssemblyTests(TestContext *testCtx)

{
  uint uVar1;
  VkPrimitiveTopology primitiveTopology;
  TestNode *this;
  TestNode *pTVar2;
  TestNode *pTVar3;
  TestNode *this_00;
  PrimitiveRestartTest *pPVar4;
  VkPrimitiveTopology topology;
  VkPrimitiveTopology topology_00;
  VkPrimitiveTopology topology_01;
  long lVar5;
  undefined1 local_70 [32];
  string *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"input_assembly","Input assembly tests");
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,testCtx,"primitive_topology","");
  lVar5 = 0;
  do {
    uVar1 = *(uint *)((long)&(anonymous_namespace)::InputAssemblyTest::s_primitiveTopologies + lVar5
                     );
    pTVar3 = (TestNode *)operator_new(0x80);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              ((string *)local_70,(_anonymous_namespace_ *)(ulong)uVar1,topology);
    local_48 = 0;
    local_40 = 0;
    local_50 = (string *)&local_40;
    tcu::TestCase::TestCase((TestCase *)pTVar3,testCtx,(char *)local_70._0_8_,(char *)&local_40);
    *(uint *)&pTVar3[1]._vptr_TestNode = uVar1;
    *(undefined4 *)((long)&pTVar3[1]._vptr_TestNode + 4) = 10;
    *(undefined1 *)&pTVar3[1].m_testCtx = 0;
    *(undefined4 *)((long)&pTVar3[1].m_testCtx + 4) = 1;
    pTVar3->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf4168;
    tcu::TestNode::addChild(pTVar2,pTVar3);
    if (local_50 != (string *)&local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x28);
  tcu::TestNode::addChild(this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"primitive_restart","Restarts indices of ");
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar3,testCtx,"index_type_uint16","");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this_00,testCtx,"index_type_uint32","");
  lVar5 = 0;
  do {
    primitiveTopology = *(VkPrimitiveTopology *)((long)&DAT_00aba420 + lVar5);
    pPVar4 = (PrimitiveRestartTest *)operator_new(0x98);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              ((string *)local_70,(_anonymous_namespace_ *)(ulong)primitiveTopology,topology_00);
    local_48 = 0;
    local_40 = 0;
    local_50 = (string *)&local_40;
    anon_unknown_0::PrimitiveRestartTest::PrimitiveRestartTest
              (pPVar4,testCtx,(string *)local_70._0_8_,(string *)&local_40,primitiveTopology,
               VK_INDEX_TYPE_UINT16);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pPVar4);
    if (local_50 != (string *)&local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    pPVar4 = (PrimitiveRestartTest *)operator_new(0x98);
    (anonymous_namespace)::getPrimitiveTopologyCaseName_abi_cxx11_
              ((string *)local_70,(_anonymous_namespace_ *)(ulong)primitiveTopology,topology_01);
    local_48 = 0;
    local_40 = 0;
    local_50 = (string *)&local_40;
    anon_unknown_0::PrimitiveRestartTest::PrimitiveRestartTest
              (pPVar4,testCtx,(string *)local_70._0_8_,(string *)&local_40,primitiveTopology,
               VK_INDEX_TYPE_UINT32);
    tcu::TestNode::addChild(this_00,(TestNode *)pPVar4);
    if (local_50 != (string *)&local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if ((string *)local_70._0_8_ != (string *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x14);
  tcu::TestNode::addChild(pTVar2,pTVar3);
  tcu::TestNode::addChild(pTVar2,this_00);
  tcu::TestNode::addChild(this,pTVar2);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createInputAssemblyTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup>		inputAssemblyTests (new tcu::TestCaseGroup(testCtx, "input_assembly", "Input assembly tests"));

	inputAssemblyTests->addChild(createPrimitiveTopologyTests(testCtx).release());
	inputAssemblyTests->addChild(createPrimitiveRestartTests(testCtx).release());

	return inputAssemblyTests.release();
}